

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repattrn.cpp
# Opt level: O0

UText * __thiscall icu_63::RegexPattern::patternText(RegexPattern *this,UErrorCode *status)

{
  UBool UVar1;
  UErrorCode *status_local;
  RegexPattern *this_local;
  
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    *status = U_ZERO_ERROR;
    if (this->fPattern == (UText *)0x0) {
      RegexStaticSets::initGlobals(status);
      this_local = *(RegexPattern **)(RegexStaticSets::gStaticSets + 0x5d8);
    }
    else {
      this_local = (RegexPattern *)this->fPattern;
    }
  }
  else {
    this_local = (RegexPattern *)0x0;
  }
  return (UText *)this_local;
}

Assistant:

UText *RegexPattern::patternText(UErrorCode      &status) const {
    if (U_FAILURE(status)) {return NULL;}
    status = U_ZERO_ERROR;

    if (fPattern != NULL) {
        return fPattern;
    } else {
        RegexStaticSets::initGlobals(&status);
        return RegexStaticSets::gStaticSets->fEmptyText;
    }
}